

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseSimdV128Const
          (WastParser *this,Const *const_,TokenType token_type,ConstType const_type)

{
  Result RVar1;
  ulong uVar2;
  Literal *pLVar3;
  char *pcVar4;
  char *end;
  int lane;
  ulong uVar5;
  ulong uStackY_170;
  allocator local_145;
  undefined4 local_144;
  ConstType local_140;
  uint local_13c;
  uint64_t value;
  size_type sStack_130;
  anon_union_16_2_ecfd7102_for_Location_1 local_128;
  undefined1 local_118 [8];
  anon_union_24_4_98baf137_for_Token_2 local_110;
  ulong local_f0;
  char *local_e8;
  size_type sStack_e0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  size_type sStack_c0;
  size_t local_b8;
  undefined8 uStack_b0;
  Location loc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Token token;
  
  local_144 = (undefined4)CONCAT71((uint7)(uint3)(const_type >> 8),1);
  local_140 = const_type;
  switch(token_type) {
  case I8X16:
    uStackY_170 = 0x10;
    break;
  case I16X8:
    uStackY_170 = 8;
    break;
  case I32X4:
    uStackY_170 = 4;
    break;
  case I64X2:
    uStackY_170 = 2;
    break;
  case F32X4:
    uStackY_170 = 4;
    goto LAB_0023d405;
  case F64X2:
    uStackY_170 = 2;
LAB_0023d405:
    local_144 = 0;
    break;
  default:
    local_c8 = (const_->loc).filename.data_;
    sStack_c0 = (const_->loc).filename.size_;
    local_b8 = (const_->loc).field_1.field_1.offset;
    uStack_b0 = *(undefined8 *)((long)&(const_->loc).field_1 + 8);
    pcVar4 = GetTokenTypeName(token_type);
    Error(this,0x28b594,pcVar4);
    return (Result)Error;
  }
  Consume((Token *)&value,this);
  GetLocation((Location *)&value,this);
  (const_->loc).field_1.field_1.offset = (size_t)local_128.field_1.offset;
  *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_128._8_8_;
  (const_->loc).filename.data_ = (char *)value;
  (const_->loc).filename.size_ = sStack_130;
  local_13c = (int)uStackY_170 - 2U >> 1;
  uVar5 = 0;
  local_f0 = (ulong)local_13c;
  while( true ) {
    if (uStackY_170 == uVar5) {
      return (Result)Ok;
    }
    GetLocation(&loc,this);
    GetToken(&token,this);
    uVar2 = (ulong)token.token_type_;
    if (0x31 < uVar2) break;
    lane = (int)uVar5;
    if ((0x800018000000U >> (uVar2 & 0x3f) & 1) != 0) {
      if ((char)local_144 == '\0') {
LAB_0023d536:
        Const::Const((Const *)&value);
        if (uStackY_170 == 2) {
          RVar1 = ParseF64(this,(Const *)&value,local_140);
          Const::set_v128_f64(const_,lane,CONCAT44(local_110._4_4_,local_110.literal_.type));
        }
        else {
          RVar1.enum_ = Ok;
          if ((int)uStackY_170 == 4) {
            RVar1 = ParseF32(this,(Const *)&value,local_140);
            Const::set_v128_f32(const_,lane,local_110.literal_.type);
          }
        }
        if (uVar5 < 4) {
          const_->nan_[uVar5] = local_110.literal_.text.size_._0_4_;
        }
        goto LAB_0023d5a0;
      }
      goto LAB_0023d6e9;
    }
    if ((0x3000000000000U >> (uVar2 & 0x3f) & 1) == 0) break;
    if ((char)local_144 == '\0') goto LAB_0023d536;
    Consume((Token *)&value,this);
    pLVar3 = Token::literal((Token *)&value);
    if (local_13c < 8) {
      pcVar4 = (pLVar3->text).data_;
      end = pcVar4 + (pLVar3->text).size_;
      switch((long)&switchD_0023d50e::switchdataD_0028afa0 +
             (long)(int)(&switchD_0023d50e::switchdataD_0028afa0)[local_f0]) {
      case 0x23d510:
        value = 0;
        RVar1 = ParseInt64(pcVar4,end,&value,SignedAndUnsigned);
        Const::set_v128_u64(const_,lane,value);
        break;
      case 0x23d5a6:
        goto switchD_0023d50e_caseD_23d5a6;
      case 0x23d5ae:
        value = value & 0xffffffffffff0000;
        RVar1 = ParseInt16(pcVar4,end,(uint16_t *)&value,SignedAndUnsigned);
        Const::set_v128_u16(const_,lane,(uint16_t)value);
        break;
      case 0x23d5d4:
        value = value & 0xffffffff00000000;
        RVar1 = ParseInt32(pcVar4,end,(uint32_t *)&value,SignedAndUnsigned);
        Const::set_v128_u32(const_,lane,(uint32_t)value);
        break;
      case 0x23d5f8:
        value = value & 0xffffffffffffff00;
        RVar1 = ParseInt8(pcVar4,end,(uint8_t *)&value,SignedAndUnsigned);
        Const::set_v128_u8(const_,lane,(uint8_t)value);
      }
LAB_0023d5a0:
      if (RVar1.enum_ == Error) {
        local_d8.offset = (size_t)loc.field_1.field_1.offset;
        uStack_d0 = loc.field_1._8_8_;
        local_e8 = loc.filename.data_;
        sStack_e0 = loc.filename.size_;
        Token::to_string_abi_cxx11_((string *)&value,&token);
        Error(this,0x28b634,(char *)value);
        std::__cxx11::string::_M_dispose();
        return (Result)Error;
      }
    }
switchD_0023d50e_caseD_23d5a6:
    uVar5 = uVar5 + 1;
  }
  if ((char)local_144 == '\0') {
    std::__cxx11::string::string((string *)&value,"a Float literal",&local_145);
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               (string *)&value,local_118);
    pcVar4 = "42.0";
    goto LAB_0023d72d;
  }
LAB_0023d6e9:
  std::__cxx11::string::string((string *)&value,"a Nat or Integer literal",&local_145);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_initialize<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             (string *)&value,local_118);
  pcVar4 = "123";
LAB_0023d72d:
  RVar1 = ErrorExpected(this,&local_88,pcVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::__cxx11::string::_M_dispose();
  return (Result)RVar1.enum_;
}

Assistant:

Result WastParser::ParseSimdV128Const(Const* const_,
                                      TokenType token_type,
                                      ConstType const_type) {
  WABT_TRACE(ParseSimdV128Const);

  uint8_t lane_count = 0;
  bool integer = true;
  switch (token_type) {
    case TokenType::I8X16: { lane_count = 16; break; }
    case TokenType::I16X8: { lane_count = 8; break; }
    case TokenType::I32X4: { lane_count = 4; break; }
    case TokenType::I64X2: { lane_count = 2; break; }
    case TokenType::F32X4: { lane_count = 4; integer = false; break; }
    case TokenType::F64X2: { lane_count = 2; integer = false; break; }
    default: {
      Error(
        const_->loc,
        "Unexpected type at start of simd constant. "
        "Expected one of: i8x16, i16x8, i32x4, i64x2, f32x4, f64x2. "
        "Found \"%s\".",
        GetTokenTypeName(token_type)
      );
      return Result::Error;
    }
  }
  Consume();

  const_->loc = GetLocation();

  for (int lane = 0; lane < lane_count; ++lane) {
    Location loc = GetLocation();

    // Check that the lane literal type matches the element type of the v128:
    Token token = GetToken();
    switch (token.token_type()) {
      case TokenType::Nat:
      case TokenType::Int:
        // OK.
        break;

      case TokenType::Float:
      case TokenType::NanArithmetic:
      case TokenType::NanCanonical:
        if (integer) {
          goto error;
        }
        break;

      error:
      default:
        if (integer) {
          return ErrorExpected({"a Nat or Integer literal"}, "123");
        } else {
          return ErrorExpected({"a Float literal"}, "42.0");
        }
    }

    Result result;

    // For each type, parse the next literal, bound check it, and write it to
    // the array of bytes:
    if (integer) {
      string_view sv = Consume().literal().text;
      const char* s = sv.begin();
      const char* end = sv.end();

      switch (lane_count) {
        case 16: {
          uint8_t value = 0;
          result = ParseInt8(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u8(lane, value);
          break;
        }
        case 8: {
          uint16_t value = 0;
          result = ParseInt16(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u16(lane, value);
          break;
        }
        case 4: {
          uint32_t value = 0;
          result = ParseInt32(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u32(lane, value);
          break;
        }
        case 2: {
          uint64_t value = 0;
          result = ParseInt64(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u64(lane, value);
          break;
        }
      }
    } else {
      Const lane_const_;
      switch (lane_count) {
        case 4:
          result = ParseF32(&lane_const_, const_type);
          const_->set_v128_f32(lane, lane_const_.f32_bits());
          break;

        case 2:
          result = ParseF64(&lane_const_, const_type);
          const_->set_v128_f64(lane, lane_const_.f64_bits());
          break;
      }

      const_->set_expected_nan(lane, lane_const_.expected_nan());
    }

    if (Failed(result)) {
      Error(loc, "invalid literal \"%s\"", token.to_string().c_str());
      return Result::Error;
    }
  }

  return Result::Ok;
}